

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O2

void ihevc_itrans_32x32(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  byte bVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  undefined4 in_register_00000084;
  int iVar24;
  int iVar25;
  WORD32 eeo [4];
  WORD32 ee [8];
  WORD32 eo [8];
  WORD32 e [16];
  WORD32 o [16];
  int local_238 [4];
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  undefined8 local_128;
  ulong local_120;
  short *local_118;
  WORD16 *local_110;
  int aiStack_108 [4];
  int aiStack_f8 [50];
  WORD32 eee [4];
  
  bVar17 = (byte)i4_shift;
  iVar25 = 1 << (bVar17 - 1 & 0x1f);
  local_140 = (long)(src_strd * 3);
  local_148 = (long)(src_strd * 5);
  local_150 = (long)(src_strd * 7);
  local_158 = (long)(src_strd * 9);
  local_160 = (long)(src_strd * 0xb);
  local_168 = (long)(src_strd * 0xd);
  local_170 = (long)(src_strd * 0xf);
  local_178 = (long)(src_strd * 0x11);
  local_180 = (long)(src_strd * 0x13);
  local_188 = (long)(src_strd * 0x15);
  local_190 = (long)(src_strd * 0x17);
  local_198 = (long)(src_strd * 0x19);
  local_1a0 = (long)(src_strd * 0x1b);
  local_1a8 = (long)(src_strd * 0x1d);
  local_1b0 = (long)(src_strd * 0x1f);
  local_1b8 = (long)(src_strd * 2);
  local_1c0 = (long)(src_strd * 6);
  local_1c8 = (long)(src_strd * 10);
  local_1d0 = (long)(src_strd * 0xe);
  local_1d8 = (long)(src_strd * 0x12);
  local_1e0 = (long)(src_strd * 0x16);
  local_1e8 = (long)(src_strd * 0x1a);
  local_1f0 = (long)(src_strd * 0x1e);
  local_1f8 = (long)(src_strd * 4);
  local_200 = (long)(src_strd * 0xc);
  local_208 = (long)(src_strd * 0x14);
  local_210 = (long)(src_strd * 0x1c);
  local_218 = (long)(src_strd * 8);
  local_220 = (long)(src_strd * 0x18);
  local_138 = (long)src_strd;
  local_228 = (long)(src_strd << 4);
  lVar21 = (long)dst_strd * 2;
  local_128 = CONCAT44(in_register_00000084,i4_shift);
  local_130 = lVar21;
  local_110 = pi2_dst;
  local_118 = pi2_src;
  for (local_120 = 0; (int)local_120 != 0x20; local_120 = (ulong)((int)local_120 + 1)) {
    if ((zero_cols & 1U) == 0) {
      sVar1 = local_118[src_strd];
      sVar2 = local_118[src_strd * 3];
      sVar3 = local_118[src_strd * 5];
      sVar4 = local_118[src_strd * 7];
      sVar5 = local_118[src_strd * 9];
      sVar6 = local_118[src_strd * 0xb];
      sVar7 = local_118[src_strd * 0xd];
      sVar8 = local_118[src_strd * 0xf];
      sVar9 = local_118[src_strd * 0x11];
      sVar10 = local_118[src_strd * 0x13];
      sVar11 = local_118[src_strd * 0x15];
      sVar12 = local_118[src_strd * 0x17];
      sVar13 = local_118[src_strd * 0x19];
      sVar14 = local_118[src_strd * 0x1b];
      sVar15 = local_118[src_strd * 0x1d];
      sVar16 = local_118[src_strd * 0x1f];
      for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
        aiStack_f8[lVar21 + 0x20] =
             (int)g_ai2_ihevc_trans_32[0x1f][lVar21] * (int)sVar16 +
             (int)g_ai2_ihevc_trans_32[0x1d][lVar21] * (int)sVar15 +
             (int)g_ai2_ihevc_trans_32[0x1b][lVar21] * (int)sVar14 +
             (int)g_ai2_ihevc_trans_32[0x19][lVar21] * (int)sVar13 +
             (int)g_ai2_ihevc_trans_32[0x17][lVar21] * (int)sVar12 +
             (int)g_ai2_ihevc_trans_32[0x15][lVar21] * (int)sVar11 +
             (int)g_ai2_ihevc_trans_32[0x13][lVar21] * (int)sVar10 +
             (int)g_ai2_ihevc_trans_32[0x11][lVar21] * (int)sVar9 +
             (int)g_ai2_ihevc_trans_32[0xf][lVar21] * (int)sVar8 +
             (int)g_ai2_ihevc_trans_32[0xd][lVar21] * (int)sVar7 +
             (int)g_ai2_ihevc_trans_32[0xb][lVar21] * (int)sVar6 +
             (int)g_ai2_ihevc_trans_32[9][lVar21] * (int)sVar5 +
             (int)g_ai2_ihevc_trans_32[7][lVar21] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_32[5][lVar21] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_32[3][lVar21] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_32[1][lVar21] * (int)sVar1;
      }
      sVar1 = local_118[src_strd * 2];
      sVar2 = local_118[src_strd * 6];
      sVar3 = local_118[src_strd * 10];
      sVar4 = local_118[src_strd * 0xe];
      sVar5 = local_118[src_strd * 0x12];
      sVar6 = local_118[src_strd * 0x16];
      sVar7 = local_118[src_strd * 0x1a];
      sVar8 = local_118[src_strd * 0x1e];
      for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
        aiStack_f8[lVar21 + 8] =
             (int)g_ai2_ihevc_trans_32[0x1e][lVar21] * (int)sVar8 +
             (int)g_ai2_ihevc_trans_32[0x1a][lVar21] * (int)sVar7 +
             (int)g_ai2_ihevc_trans_32[0x16][lVar21] * (int)sVar6 +
             (int)g_ai2_ihevc_trans_32[0x12][lVar21] * (int)sVar5 +
             (int)g_ai2_ihevc_trans_32[0xe][lVar21] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_32[10][lVar21] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_32[6][lVar21] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_32[2][lVar21] * (int)sVar1;
      }
      sVar1 = local_118[src_strd * 4];
      sVar2 = local_118[src_strd * 0xc];
      sVar3 = local_118[src_strd * 0x14];
      sVar4 = local_118[src_strd * 0x1c];
      for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
        aiStack_108[lVar21] =
             (int)g_ai2_ihevc_trans_32[0x1c][lVar21] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_32[0x14][lVar21] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_32[0xc][lVar21] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_32[4][lVar21] * (int)sVar1;
      }
      iVar22 = local_118[src_strd * 0x18] * 0x24 + local_118[src_strd * 8] * 0x53;
      iVar18 = local_118[src_strd * 0x18] * -0x53 + local_118[src_strd * 8] * 0x24;
      iVar23 = local_118[src_strd << 4] * 0x40 + *local_118 * 0x40;
      iVar24 = local_118[src_strd << 4] * -0x40 + *local_118 * 0x40;
      local_238[0] = iVar23 + iVar22;
      local_238[3] = iVar23 - iVar22;
      local_238[1] = iVar24 + iVar18;
      local_238[2] = iVar24 - iVar18;
      lVar21 = 0xc;
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 4) {
        iVar18 = *(int *)((long)local_238 + lVar21);
        iVar22 = *(int *)((long)aiStack_108 + lVar21);
        *(int *)((long)aiStack_f8 + lVar19) =
             *(int *)((long)aiStack_108 + lVar19) + *(int *)((long)local_238 + lVar19);
        *(int *)((long)aiStack_f8 + lVar19 + 0x10) = iVar18 - iVar22;
        lVar21 = lVar21 + -4;
      }
      lVar21 = 0x1c;
      for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 4) {
        iVar18 = *(int *)((long)aiStack_f8 + lVar21);
        iVar22 = *(int *)((long)aiStack_f8 + lVar21 + 0x20);
        *(int *)((long)aiStack_f8 + lVar19 + 0x40) =
             *(int *)((long)aiStack_f8 + lVar19 + 0x20) + *(int *)((long)aiStack_f8 + lVar19);
        *(int *)((long)aiStack_f8 + lVar19 + 0x60) = iVar18 - iVar22;
        lVar21 = lVar21 + -4;
      }
      lVar19 = 0x3c;
      for (lVar20 = 0; lVar21 = local_130, lVar20 != 0x20; lVar20 = lVar20 + 2) {
        iVar18 = *(int *)((long)aiStack_f8 + lVar20 * 2 + 0x40) + iVar25 +
                 *(int *)((long)eee + lVar20 * 2 + -0x48) >> (bVar17 & 0x1f);
        if (iVar18 < -0x7fff) {
          iVar18 = -0x8000;
        }
        if (0x7ffe < iVar18) {
          iVar18 = 0x7fff;
        }
        *(short *)((long)local_110 + lVar20) = (short)iVar18;
        iVar18 = (*(int *)((long)aiStack_f8 + lVar19 + 0x40) + iVar25) -
                 *(int *)((long)aiStack_f8 + lVar19 + 0x80) >> (bVar17 & 0x1f);
        if (iVar18 < -0x7fff) {
          iVar18 = -0x8000;
        }
        if (0x7ffe < iVar18) {
          iVar18 = 0x7fff;
        }
        *(short *)((long)local_110 + lVar20 + 0x20) = (short)iVar18;
        lVar19 = lVar19 + -4;
      }
    }
    else {
      local_110[0x18] = 0;
      local_110[0x19] = 0;
      local_110[0x1a] = 0;
      local_110[0x1b] = 0;
      local_110[0x1c] = 0;
      local_110[0x1d] = 0;
      local_110[0x1e] = 0;
      local_110[0x1f] = 0;
      local_110[0x10] = 0;
      local_110[0x11] = 0;
      local_110[0x12] = 0;
      local_110[0x13] = 0;
      local_110[0x14] = 0;
      local_110[0x15] = 0;
      local_110[0x16] = 0;
      local_110[0x17] = 0;
      local_110[8] = 0;
      local_110[9] = 0;
      local_110[10] = 0;
      local_110[0xb] = 0;
      local_110[0xc] = 0;
      local_110[0xd] = 0;
      local_110[0xe] = 0;
      local_110[0xf] = 0;
      local_110[0] = 0;
      local_110[1] = 0;
      local_110[2] = 0;
      local_110[3] = 0;
      local_110[4] = 0;
      local_110[5] = 0;
      local_110[6] = 0;
      local_110[7] = 0;
    }
    local_118 = local_118 + 1;
    local_110 = (WORD16 *)((long)local_110 + lVar21);
    zero_cols = zero_cols >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_32x32(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[16], o[16];
    WORD32 ee[8], eo[8];
    WORD32 eee[4], eeo[4];
    WORD32 eeee[2], eeeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_32; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_32 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 16; k++)
            {
                o[k] = g_ai2_ihevc_trans_32[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_32[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_32[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_32[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_32[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_32[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_32[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_32[15][k]
                                                * pi2_src[15 * src_strd]
                                + g_ai2_ihevc_trans_32[17][k]
                                                * pi2_src[17 * src_strd]
                                + g_ai2_ihevc_trans_32[19][k]
                                                * pi2_src[19 * src_strd]
                                + g_ai2_ihevc_trans_32[21][k]
                                                * pi2_src[21 * src_strd]
                                + g_ai2_ihevc_trans_32[23][k]
                                                * pi2_src[23 * src_strd]
                                + g_ai2_ihevc_trans_32[25][k]
                                                * pi2_src[25 * src_strd]
                                + g_ai2_ihevc_trans_32[27][k]
                                                * pi2_src[27 * src_strd]
                                + g_ai2_ihevc_trans_32[29][k]
                                                * pi2_src[29 * src_strd]
                                + g_ai2_ihevc_trans_32[31][k]
                                                * pi2_src[31 * src_strd];
            }
            for(k = 0; k < 8; k++)
            {
                eo[k] = g_ai2_ihevc_trans_32[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_32[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_32[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_32[14][k]
                                                * pi2_src[14 * src_strd]
                                + g_ai2_ihevc_trans_32[18][k]
                                                * pi2_src[18 * src_strd]
                                + g_ai2_ihevc_trans_32[22][k]
                                                * pi2_src[22 * src_strd]
                                + g_ai2_ihevc_trans_32[26][k]
                                                * pi2_src[26 * src_strd]
                                + g_ai2_ihevc_trans_32[30][k]
                                                * pi2_src[30 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eeo[k] = g_ai2_ihevc_trans_32[4][k] * pi2_src[4 * src_strd]
                                + g_ai2_ihevc_trans_32[12][k]
                                                * pi2_src[12 * src_strd]
                                + g_ai2_ihevc_trans_32[20][k]
                                                * pi2_src[20 * src_strd]
                                + g_ai2_ihevc_trans_32[28][k]
                                                * pi2_src[28 * src_strd];
            }
            eeeo[0] = g_ai2_ihevc_trans_32[8][0] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][0]
                                            * pi2_src[24 * src_strd];
            eeeo[1] = g_ai2_ihevc_trans_32[8][1] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][1]
                                            * pi2_src[24 * src_strd];
            eeee[0] = g_ai2_ihevc_trans_32[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][0]
                                            * pi2_src[16 * src_strd];
            eeee[1] = g_ai2_ihevc_trans_32[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][1]
                                            * pi2_src[16 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            eee[0] = eeee[0] + eeeo[0];
            eee[3] = eeee[0] - eeeo[0];
            eee[1] = eeee[1] + eeeo[1];
            eee[2] = eeee[1] - eeeo[1];
            for(k = 0; k < 4; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 4] = eee[3 - k] - eeo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 8] = ee[7 - k] - eo[7 - k];
            }
            for(k = 0; k < 16; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 16] =
                                CLIP_S16(((e[15 - k] - o[15 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}